

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

TryEmplaceResult * __thiscall
QHash<QPixmapStyle::ControlDescriptor,QPixmapStyleDescriptor>::
tryEmplace_impl<QPixmapStyle::ControlDescriptor_const&>
          (TryEmplaceResult *__return_storage_ptr__,void *this,ControlDescriptor *key)

{
  uchar uVar1;
  Span *pSVar2;
  Data<QHashPrivate::Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>_> *pDVar3;
  ulong uVar4;
  Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *pNVar6;
  long in_FS_OFFSET;
  Bucket BVar8;
  QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> local_40;
  long local_38;
  Span *pSVar5;
  ulong uVar7;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = *this;
  if (pDVar3 == (Data<QHashPrivate::Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>_>
                 *)0x0) {
    pDVar3 = QHashPrivate::
             Data<QHashPrivate::Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>_>::
             detached((Data<QHashPrivate::Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>_>
                       *)0x0);
    *(Data<QHashPrivate::Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>_> **)this =
         pDVar3;
  }
  local_40.d = (Data *)0x0;
  uVar4 = (pDVar3->seed >> 0x20 ^ (ulong)*key ^ pDVar3->seed) * -0x2917014799a6026d;
  uVar4 = (uVar4 >> 0x20 ^ uVar4) * -0x2917014799a6026d;
  uVar4 = uVar4 >> 0x20 ^ uVar4;
  BVar8 = QHashPrivate::
          Data<QHashPrivate::Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>_>::
          findBucketWithHash<QPixmapStyle::ControlDescriptor>(pDVar3,key,uVar4);
  uVar7 = BVar8.index;
  pSVar5 = BVar8.span;
  uVar1 = pSVar5->offsets[uVar7];
  pDVar3 = *this;
  if ((pDVar3 == (Data<QHashPrivate::Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>_>
                  *)0x0) || (1 < (uint)(pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i))
  {
    QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::operator=
              (&local_40,(QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)this);
    if (uVar1 == 0xff) {
LAB_00345c73:
      pDVar3 = *this;
      if (pDVar3->numBuckets >> 1 <= pDVar3->size) {
        pDVar3 = QHashPrivate::
                 Data<QHashPrivate::Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>_>
                 ::detached(pDVar3,pDVar3->size + 1);
        *(Data<QHashPrivate::Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>_> **)this
             = pDVar3;
        BVar8 = QHashPrivate::
                Data<QHashPrivate::Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>_>::
                findBucketWithHash<QPixmapStyle::ControlDescriptor>(pDVar3,key,uVar4);
        goto LAB_00345cf0;
      }
    }
    else {
      pDVar3 = *this;
    }
    pSVar2 = pDVar3->spans;
    pDVar3 = QHashPrivate::
             Data<QHashPrivate::Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>_>::
             detached(pDVar3);
    *(Data<QHashPrivate::Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>_> **)this =
         pDVar3;
    BVar8.index._0_4_ = (uint)BVar8.index & 0x7f;
    BVar8.span = pDVar3->spans +
                 ((((ulong)((long)pSVar5 - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | uVar7) >> 7);
    BVar8.index._4_4_ = 0;
    if (uVar1 != 0xff) goto LAB_00345d27;
  }
  else {
    if (uVar1 != 0xff) goto LAB_00345d27;
    if (pDVar3->numBuckets >> 1 <= pDVar3->size) {
      QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::operator=
                (&local_40,(QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)this);
      goto LAB_00345c73;
    }
  }
LAB_00345cf0:
  pNVar6 = QHashPrivate::
           Span<QHashPrivate::Node<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>_>::
           insert(BVar8.span,BVar8.index);
  pNVar6->key = *key;
  (pNVar6->value).fileName.d.size = 0;
  (pNVar6->value).fileName.d.d = (Data *)0x0;
  (pNVar6->value).fileName.d.ptr = (char16_t *)0x0;
  (pNVar6->value).size.wd = -1;
  (pNVar6->value).size.ht = -1;
  (pNVar6->value).tileRules.horizontal = StretchTile;
  (pNVar6->value).tileRules.vertical = StretchTile;
  (pNVar6->value).margins.m_left = 0;
  (pNVar6->value).margins.m_top = 0;
  (pNVar6->value).margins.m_right = 0;
  (pNVar6->value).margins.m_bottom = 0;
  pDVar3 = *this;
  pDVar3->size = pDVar3->size + 1;
LAB_00345d27:
  pSVar5 = pDVar3->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar3;
  (__return_storage_ptr__->iterator).i.bucket =
       ((ulong)((long)BVar8.span - (long)pSVar5) >> 4) * 0x1c71c71c71c71c80 | BVar8.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }